

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_643cf::StatTask::inputsAvailable(StatTask *this,TaskInterface ti)

{
  StatNode *this_00;
  FileInfo outputInfo;
  bool bVar1;
  BuildSystemImpl *pBVar2;
  long lVar3;
  FileInfo *pFVar4;
  uint64_t *puVar5;
  byte bVar6;
  TaskInterface in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffec8 [64];
  undefined1 auVar7 [32];
  TaskInterface ti_local;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  FileInfo info;
  BuildValue local_80;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  bVar6 = 0;
  this_00 = this->statnode;
  pBVar2 = getBuildSystem(in_stack_fffffffffffffeb8);
  llbuild::buildsystem::StatNode::getFileInfo
            (&info,this_00,
             (pBVar2->fileSystem)._M_t.
             super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
             .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl);
  bVar1 = llbuild::basic::FileInfo::isMissing(&info);
  if (bVar1) {
    local_80.kind = MissingInput;
    local_80._4_8_ = 0;
    local_80._12_8_ = 0;
    local_80.valueData._4_8_ = 0;
    local_80.valueData._12_8_ = 0;
    local_80.valueData._20_8_ = 0;
    local_80.valueData._28_8_ = 0;
    local_80.valueData._36_8_ = 0;
    local_80.valueData._44_8_ = 0;
    local_80.valueData._52_8_ = 0;
    local_80.valueData._60_8_ = 0;
    local_80.valueData._68_8_ = 0;
    local_80.valueData._76_4_ = 0;
    local_80.stringValues.contents._0_4_ = 0;
    local_80.stringValues.contents._4_4_ = 0;
    local_80.stringValues.size = 0;
  }
  else {
    pFVar4 = &info;
    puVar5 = (uint64_t *)&stack0xfffffffffffffeb8;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = pFVar4->device;
      pFVar4 = (FileInfo *)((long)pFVar4 + (ulong)bVar6 * -0x10 + 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    auVar7 = in_stack_fffffffffffffec8._32_32_;
    outputInfo.mode = in_stack_fffffffffffffec8._0_8_;
    outputInfo.size = in_stack_fffffffffffffec8._8_8_;
    outputInfo.modTime.seconds = SUB168(in_stack_fffffffffffffec8._16_16_,0);
    outputInfo.modTime.nanoseconds = SUB168(in_stack_fffffffffffffec8._16_16_,8);
    outputInfo.checksum.bytes[0] = auVar7[0];
    outputInfo.checksum.bytes[1] = auVar7[1];
    outputInfo.checksum.bytes[2] = auVar7[2];
    outputInfo.checksum.bytes[3] = auVar7[3];
    outputInfo.checksum.bytes[4] = auVar7[4];
    outputInfo.checksum.bytes[5] = auVar7[5];
    outputInfo.checksum.bytes[6] = auVar7[6];
    outputInfo.checksum.bytes[7] = auVar7[7];
    outputInfo.checksum.bytes[8] = auVar7[8];
    outputInfo.checksum.bytes[9] = auVar7[9];
    outputInfo.checksum.bytes[10] = auVar7[10];
    outputInfo.checksum.bytes[0xb] = auVar7[0xb];
    outputInfo.checksum.bytes[0xc] = auVar7[0xc];
    outputInfo.checksum.bytes[0xd] = auVar7[0xd];
    outputInfo.checksum.bytes[0xe] = auVar7[0xe];
    outputInfo.checksum.bytes[0xf] = auVar7[0xf];
    outputInfo.checksum.bytes[0x10] = auVar7[0x10];
    outputInfo.checksum.bytes[0x11] = auVar7[0x11];
    outputInfo.checksum.bytes[0x12] = auVar7[0x12];
    outputInfo.checksum.bytes[0x13] = auVar7[0x13];
    outputInfo.checksum.bytes[0x14] = auVar7[0x14];
    outputInfo.checksum.bytes[0x15] = auVar7[0x15];
    outputInfo.checksum.bytes[0x16] = auVar7[0x16];
    outputInfo.checksum.bytes[0x17] = auVar7[0x17];
    outputInfo.checksum.bytes[0x18] = auVar7[0x18];
    outputInfo.checksum.bytes[0x19] = auVar7[0x19];
    outputInfo.checksum.bytes[0x1a] = auVar7[0x1a];
    outputInfo.checksum.bytes[0x1b] = auVar7[0x1b];
    outputInfo.checksum.bytes[0x1c] = auVar7[0x1c];
    outputInfo.checksum.bytes[0x1d] = auVar7[0x1d];
    outputInfo.checksum.bytes[0x1e] = auVar7[0x1e];
    outputInfo.checksum.bytes[0x1f] = auVar7[0x1f];
    outputInfo.device = (uint64_t)in_stack_fffffffffffffeb8.impl;
    outputInfo.inode = (uint64_t)in_stack_fffffffffffffeb8.ctx;
    llbuild::buildsystem::BuildValue::makeExistingInput(outputInfo);
  }
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_e8,&local_80);
  llbuild::core::TaskInterface::complete(&ti_local,(ValueType *)&local_e8,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.

    // Get the information on the file.
    auto info = statnode.getFileInfo(getBuildSystem(ti).getFileSystem());
    if (info.isMissing()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    ti.complete(BuildValue::makeExistingInput(info).toData());
  }